

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_dimension_add_counter
                   (PS_Dimension dim,FT_Int hint1,FT_Int hint2,FT_Int hint3,FT_Memory memory)

{
  FT_Int FVar1;
  PS_Mask local_38;
  PS_Mask counter;
  FT_UInt count;
  FT_Error error;
  FT_Memory memory_local;
  FT_UInt local_18;
  FT_Int hint3_local;
  FT_Int hint2_local;
  FT_Int hint1_local;
  PS_Dimension dim_local;
  
  counter._4_4_ = 0;
  counter._0_4_ = (dim->counters).num_masks;
  local_38 = (dim->counters).masks;
  _count = memory;
  memory_local._4_4_ = hint3;
  local_18 = hint2;
  hint3_local = hint1;
  _hint2_local = dim;
  while (((((FT_UInt)counter != 0 && (FVar1 = ps_mask_test_bit(local_38,hint3_local), FVar1 == 0))
          && (FVar1 = ps_mask_test_bit(local_38,local_18), FVar1 == 0)) &&
         (FVar1 = ps_mask_test_bit(local_38,memory_local._4_4_), FVar1 == 0))) {
    counter._0_4_ = (FT_UInt)counter - 1;
    local_38 = local_38 + 1;
  }
  if ((((((FT_UInt)counter != 0) ||
        (counter._4_4_ = ps_mask_table_alloc(&_hint2_local->counters,_count,&local_38),
        counter._4_4_ == 0)) &&
       ((hint3_local < 0 ||
        (counter._4_4_ = ps_mask_set_bit(local_38,hint3_local,_count), counter._4_4_ == 0)))) &&
      (((int)local_18 < 0 ||
       (counter._4_4_ = ps_mask_set_bit(local_38,local_18,_count), counter._4_4_ == 0)))) &&
     (-1 < (int)memory_local._4_4_)) {
    counter._4_4_ = ps_mask_set_bit(local_38,memory_local._4_4_,_count);
  }
  return counter._4_4_;
}

Assistant:

static FT_Error
  ps_dimension_add_counter( PS_Dimension  dim,
                            FT_Int        hint1,
                            FT_Int        hint2,
                            FT_Int        hint3,
                            FT_Memory     memory )
  {
    FT_Error  error   = FT_Err_Ok;
    FT_UInt   count   = dim->counters.num_masks;
    PS_Mask   counter = dim->counters.masks;


    /* try to find an existing counter mask that already uses */
    /* one of these stems here                                */
    for ( ; count > 0; count--, counter++ )
    {
      if ( ps_mask_test_bit( counter, hint1 ) ||
           ps_mask_test_bit( counter, hint2 ) ||
           ps_mask_test_bit( counter, hint3 ) )
        break;
    }

    /* create a new counter when needed */
    if ( count == 0 )
    {
      error = ps_mask_table_alloc( &dim->counters, memory, &counter );
      if ( error )
        goto Exit;
    }

    /* now, set the bits for our hints in the counter mask */
    if ( hint1 >= 0 )
    {
      error = ps_mask_set_bit( counter, (FT_UInt)hint1, memory );
      if ( error )
        goto Exit;
    }

    if ( hint2 >= 0 )
    {
      error = ps_mask_set_bit( counter, (FT_UInt)hint2, memory );
      if ( error )
        goto Exit;
    }

    if ( hint3 >= 0 )
    {
      error = ps_mask_set_bit( counter, (FT_UInt)hint3, memory );
      if ( error )
        goto Exit;
    }

  Exit:
    return error;
  }